

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void __thiscall ObjectBlockPool<8,_8192>::~ObjectBlockPool(ObjectBlockPool<8,_8192> *this)

{
  Reset(this);
  FastVector<SmallBlock<8>_*,_false,_false>::~FastVector(&this->objectsToFree);
  FastVector<SmallBlock<8>_*,_false,_false>::~FastVector(&this->objectsToFinalize);
  FastVector<LargeBlock<8,_8192>_*,_false,_false>::~FastVector(&this->sortedPages);
  return;
}

Assistant:

~ObjectBlockPool()
	{
		Reset();
	}